

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::MapFieldBase::Swap(MapFieldBase *this,MapFieldBase *other)

{
  Arena *pAVar1;
  Arena *pAVar2;
  
  pAVar1 = arena(this);
  pAVar2 = arena(other);
  if (pAVar1 != pAVar2) {
    SwapPayload(this,other);
    UntypedMapBase::UntypedSwap((UntypedMapBase *)(this + 1),(UntypedMapBase *)(other + 1));
    return;
  }
  InternalSwap(this,other);
  return;
}

Assistant:

void MapFieldBase::Swap(MapFieldBase* other) {
  if (arena() == other->arena()) {
    InternalSwap(other);
    return;
  }
  MapFieldBase::SwapPayload(*this, *other);
  GetMapRaw().UntypedSwap(other->GetMapRaw());
}